

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

void __thiscall TRM::ActiveEdgeList::rewind(ActiveEdgeList *this,FILE *__stream)

{
  char *__filename;
  Edge *pEVar1;
  Edge *pEVar2;
  bool bVar3;
  Edge **ppEVar4;
  Vertex *in_RDX;
  Edge *pEVar5;
  Vertex *pVVar6;
  Vertex *local_40;
  
  if (((__stream != (FILE *)0x0) && (local_40 = *(Vertex **)__stream, local_40 != in_RDX)) &&
     (bVar3 = VertexCompare::Compare((vec2 *)(local_40 + 0x48),(vec2 *)(in_RDX + 0x48)), !bVar3)) {
    while (local_40 != in_RDX) {
      local_40 = *(Vertex **)(local_40 + 8);
      pVVar6 = local_40 + 0x28;
      while (__filename = *(char **)pVVar6, __filename != (char *)0x0) {
        remove(this,__filename);
        pVVar6 = (Vertex *)(__filename + 0x30);
      }
      pVVar6 = local_40 + 0x18;
      pEVar5 = *(Edge **)(local_40 + 0x38);
      while (pEVar1 = *(Edge **)pVVar6, pEVar1 != (Edge *)0x0) {
        ppEVar4 = &pEVar5->right;
        if (pEVar5 == (Edge *)0x0) {
          ppEVar4 = (Edge **)this;
        }
        pEVar2 = *ppEVar4;
        pEVar1->left = pEVar5;
        pEVar1->right = pEVar2;
        *ppEVar4 = pEVar1;
        ppEVar4 = &pEVar2->left;
        if (pEVar2 == (Edge *)0x0) {
          ppEVar4 = &(this->super_LinkedList<TRM::Edge>).tail;
        }
        *ppEVar4 = pEVar1;
        pVVar6 = pEVar1->top;
        bVar3 = VertexCompare::Compare((vec2 *)(pVVar6 + 0x48),(vec2 *)(in_RDX + 0x48));
        if ((bVar3) &&
           (((*(Edge **)(pVVar6 + 0x38) != (Edge *)0x0 &&
             (bVar3 = Edge::is_left_of(*(Edge **)(pVVar6 + 0x38),(vec2 *)(pVVar6 + 0x48)), !bVar3))
            || ((*(Edge **)(pVVar6 + 0x40) != (Edge *)0x0 &&
                (bVar3 = Edge::is_right_of(*(Edge **)(pVVar6 + 0x40),(vec2 *)(pEVar1->top + 0x48)),
                !bVar3)))))) {
          in_RDX = pVVar6;
        }
        pEVar5 = pEVar1;
        pVVar6 = (Vertex *)&pEVar1->above_next;
      }
    }
    *(Vertex **)__stream = local_40;
  }
  return;
}

Assistant:

void ActiveEdgeList::rewind(Vertex** current, Vertex* dst) {
  if (!current || *current == dst ||
      VertexCompare::Compare((*current)->point, dst->point)) {
    return;
  }

  Vertex* v = *current;

  while (v != dst) {
    v = v->prev;

    for (auto e = v->edge_below.head; e; e = e->below_next) {
      this->remove(e);
    }

    auto left = v->left;

    for (auto e = v->edge_above.head; e; e = e->above_next) {
      this->insert(e, left);
      left = e;

      auto top = e->top;
      if (VertexCompare::Compare(top->point, dst->point) &&
          ((top->left && !top->left->is_left_of(e->top->point)) ||
           (top->right && !top->right->is_right_of(e->top->point)))) {
        dst = top;
      }
    }
  }

  *current = v;
}